

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pixel.cpp
# Opt level: O0

void __thiscall Pixel_d::print(Pixel_d *this,ostream *os)

{
  ostream *poVar1;
  double *pdVar2;
  ostream *os_local;
  Pixel_d *this_local;
  
  poVar1 = std::operator<<(os,"Pixel[");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,this->x);
  poVar1 = std::operator<<(poVar1,',');
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,this->y);
  poVar1 = std::operator<<(poVar1,"](");
  pdVar2 = cv::Vec<double,_3>::operator[](&this->color,0);
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,*pdVar2);
  poVar1 = std::operator<<(poVar1,',');
  pdVar2 = cv::Vec<double,_3>::operator[](&this->color,1);
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,*pdVar2);
  poVar1 = std::operator<<(poVar1,',');
  pdVar2 = cv::Vec<double,_3>::operator[](&this->color,2);
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,*pdVar2);
  std::operator<<(poVar1,')');
  return;
}

Assistant:

void Pixel_d::print(std::ostream& os) const
{
  os << "Pixel[" << (double)x << ',' << (double)y << "]("
     << color[0] << ','
     << color[1] << ','
     << color[2] << ')';
}